

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundConjunctionExpression::Deserialize
          (BoundConjunctionExpression *this,Deserializer *deserializer)

{
  ExpressionType type;
  tuple<duckdb::BoundConjunctionExpression_*,_std::default_delete<duckdb::BoundConjunctionExpression>_>
  this_00;
  pointer pBVar1;
  __uniq_ptr_impl<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::BoundConjunctionExpression_*,_std::default_delete<duckdb::BoundConjunctionExpression>_>
  .super__Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::BoundConjunctionExpression_*,_std::default_delete<duckdb::BoundConjunctionExpression>_>
        )operator_new(0x70);
  type = SerializationData::Get<duckdb::ExpressionType>(&deserializer->data);
  BoundConjunctionExpression
            ((BoundConjunctionExpression *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::BoundConjunctionExpression_*,_std::default_delete<duckdb::BoundConjunctionExpression>_>
             .super__Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false>._M_head_impl,type);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundConjunctionExpression_*,_std::default_delete<duckdb::BoundConjunctionExpression>_>
  .super__Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false>._M_head_impl =
       (tuple<duckdb::BoundConjunctionExpression_*,_std::default_delete<duckdb::BoundConjunctionExpression>_>
        )(tuple<duckdb::BoundConjunctionExpression_*,_std::default_delete<duckdb::BoundConjunctionExpression>_>
          )this_00.
           super__Tuple_impl<0UL,_duckdb::BoundConjunctionExpression_*,_std::default_delete<duckdb::BoundConjunctionExpression>_>
           .super__Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false>._M_head_impl;
  pBVar1 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,200,"children",&pBVar1->children);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundConjunctionExpression_*,_std::default_delete<duckdb::BoundConjunctionExpression>_>
       .super__Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundConjunctionExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BoundConjunctionExpression>(new BoundConjunctionExpression(deserializer.Get<ExpressionType>()));
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(200, "children", result->children);
	return std::move(result);
}